

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormat::toPattern(DecimalFormat *this,UnicodeString *result)

{
  bool bVar1;
  UBool UVar2;
  DecimalFormatProperties *pDVar3;
  UErrorCode *pUVar4;
  bool local_382;
  UnicodeString local_370;
  bool local_32d;
  bool useCurrency;
  undefined1 local_320 [8];
  DecimalFormatProperties tprops;
  ErrorCode localStatus;
  UnicodeString *result_local;
  DecimalFormat *this_local;
  
  ErrorCode::ErrorCode((ErrorCode *)&tprops.secondaryGroupingSize);
  pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator*
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties
            ((DecimalFormatProperties *)local_320,pDVar3);
  bVar1 = icu_63::number::impl::NullableValue<icu_63::CurrencyUnit>::isNull
                    ((NullableValue<icu_63::CurrencyUnit> *)&tprops);
  local_382 = true;
  if (bVar1) {
    UVar2 = LocalPointerBase<icu_63::CurrencyPluralInfo>::isNull
                      ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)
                       &tprops.currency.fValue.field_0x18);
    local_382 = true;
    if (UVar2 != '\0') {
      bVar1 = icu_63::number::impl::NullableValue<UCurrencyUsage>::isNull
                        ((NullableValue<UCurrencyUsage> *)&tprops.currencyPluralInfo);
      local_382 = true;
      if (bVar1) {
        pUVar4 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)&tprops.secondaryGroupingSize)
        ;
        bVar1 = icu_63::number::impl::AffixUtils::hasCurrencySymbols
                          ((UnicodeString *)((long)&tprops.positivePrefix.fUnion + 0x30),pUVar4);
        local_382 = true;
        if (!bVar1) {
          pUVar4 = ErrorCode::operator_cast_to_UErrorCode_
                             ((ErrorCode *)&tprops.secondaryGroupingSize);
          bVar1 = icu_63::number::impl::AffixUtils::hasCurrencySymbols
                            ((UnicodeString *)((long)&tprops.positiveSuffix.fUnion + 0x30),pUVar4);
          local_382 = true;
          if (!bVar1) {
            pUVar4 = ErrorCode::operator_cast_to_UErrorCode_
                               ((ErrorCode *)&tprops.secondaryGroupingSize);
            bVar1 = icu_63::number::impl::AffixUtils::hasCurrencySymbols
                              ((UnicodeString *)((long)&tprops.negativePrefix.fUnion + 0x30),pUVar4)
            ;
            local_382 = true;
            if (!bVar1) {
              pUVar4 = ErrorCode::operator_cast_to_UErrorCode_
                                 ((ErrorCode *)&tprops.secondaryGroupingSize);
              local_382 = icu_63::number::impl::AffixUtils::hasCurrencySymbols
                                    ((UnicodeString *)((long)&tprops.negativeSuffix.fUnion + 0x30),
                                     pUVar4);
            }
          }
        }
      }
    }
  }
  local_32d = local_382;
  if (local_382 != false) {
    pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       (&(this->fields->exportedProperties).
                         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
    tprops.maximumSignificantDigits = pDVar3->minimumFractionDigits;
    pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       (&(this->fields->exportedProperties).
                         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
    tprops._76_4_ = pDVar3->maximumFractionDigits;
    pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       (&(this->fields->exportedProperties).
                         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
    tprops.positiveSuffixPattern.fUnion._48_8_ = pDVar3->roundingIncrement;
  }
  pUVar4 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)&tprops.secondaryGroupingSize);
  icu_63::number::impl::PatternStringUtils::propertiesToPatternString
            (&local_370,(DecimalFormatProperties *)local_320,pUVar4);
  UnicodeString::operator=(result,&local_370);
  UnicodeString::~UnicodeString(&local_370);
  icu_63::number::impl::DecimalFormatProperties::~DecimalFormatProperties
            ((DecimalFormatProperties *)local_320);
  ErrorCode::~ErrorCode((ErrorCode *)&tprops.secondaryGroupingSize);
  return result;
}

Assistant:

UnicodeString& DecimalFormat::toPattern(UnicodeString& result) const {
    // Pull some properties from exportedProperties and others from properties
    // to keep affix patterns intact.  In particular, pull rounding properties
    // so that CurrencyUsage is reflected properly.
    // TODO: Consider putting this logic in number_patternstring.cpp instead.
    ErrorCode localStatus;
    DecimalFormatProperties tprops(*fields->properties);
    bool useCurrency = ((!tprops.currency.isNull()) || !tprops.currencyPluralInfo.fPtr.isNull() ||
                        !tprops.currencyUsage.isNull() || AffixUtils::hasCurrencySymbols(
            tprops.positivePrefixPattern, localStatus) || AffixUtils::hasCurrencySymbols(
            tprops.positiveSuffixPattern, localStatus) || AffixUtils::hasCurrencySymbols(
            tprops.negativePrefixPattern, localStatus) || AffixUtils::hasCurrencySymbols(
            tprops.negativeSuffixPattern, localStatus));
    if (useCurrency) {
        tprops.minimumFractionDigits = fields->exportedProperties->minimumFractionDigits;
        tprops.maximumFractionDigits = fields->exportedProperties->maximumFractionDigits;
        tprops.roundingIncrement = fields->exportedProperties->roundingIncrement;
    }
    result = PatternStringUtils::propertiesToPatternString(tprops, localStatus);
    return result;
}